

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz77.c
# Opt level: O1

void ZopfliCopyLZ77Store(ZopfliLZ77Store *source,ZopfliLZ77Store *dest)

{
  uchar *puVar1;
  size_t sVar2;
  unsigned_short *puVar3;
  unsigned_short *puVar4;
  size_t *psVar5;
  unsigned_short *puVar6;
  unsigned_short *puVar7;
  undefined1 auVar8 [16];
  size_t __size;
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  size_t *psVar11;
  unsigned_short *puVar12;
  unsigned_short *puVar13;
  size_t *psVar14;
  size_t *psVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  size_t sVar19;
  
  uVar16 = source->size + 0x11f;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = uVar16;
  uVar18 = source->size + 0x1f & 0xffffffffffffffe0;
  ZopfliCleanLZ77Store(dest);
  puVar1 = source->data;
  dest->pos = (size_t *)0x0;
  dest->litlens = (unsigned_short *)0x0;
  dest->dists = (unsigned_short *)0x0;
  dest->size = 0;
  dest->data = puVar1;
  dest->ll_symbol = (unsigned_short *)0x0;
  dest->d_symbol = (unsigned_short *)0x0;
  dest->ll_counts = (size_t *)0x0;
  dest->d_counts = (size_t *)0x0;
  sVar2 = source->size;
  __size = sVar2 * 2;
  puVar9 = (unsigned_short *)malloc(__size);
  dest->litlens = puVar9;
  puVar10 = (unsigned_short *)malloc(__size);
  dest->dists = puVar10;
  psVar11 = (size_t *)malloc(sVar2 * 8);
  dest->pos = psVar11;
  puVar12 = (unsigned_short *)malloc(__size);
  dest->ll_symbol = puVar12;
  puVar13 = (unsigned_short *)malloc(__size);
  dest->d_symbol = puVar13;
  psVar14 = (size_t *)
            malloc((SUB168(auVar8 * ZEXT816(0xe38e38e38e38e38f),8) & 0xffffffffffffff00) * 9);
  dest->ll_counts = psVar14;
  psVar15 = (size_t *)malloc(uVar18 * 8);
  dest->d_counts = psVar15;
  if ((((puVar9 != (unsigned_short *)0x0) && (puVar10 != (unsigned_short *)0x0)) &&
      (psVar11 != (size_t *)0x0)) &&
     (((puVar12 != (unsigned_short *)0x0 && (puVar13 != (unsigned_short *)0x0)) &&
      ((psVar14 != (size_t *)0x0 && (psVar15 != (size_t *)0x0)))))) {
    dest->size = sVar2;
    sVar2 = source->size;
    if (sVar2 != 0) {
      puVar3 = source->litlens;
      puVar4 = source->dists;
      psVar5 = source->pos;
      puVar6 = source->ll_symbol;
      puVar7 = source->d_symbol;
      sVar19 = 0;
      do {
        puVar9[sVar19] = puVar3[sVar19];
        puVar10[sVar19] = puVar4[sVar19];
        psVar11[sVar19] = psVar5[sVar19];
        puVar12[sVar19] = puVar6[sVar19];
        puVar13[sVar19] = puVar7[sVar19];
        sVar19 = sVar19 + 1;
      } while (sVar2 != sVar19);
    }
    if (0x11f < uVar16) {
      psVar11 = source->ll_counts;
      lVar17 = 0;
      do {
        psVar14[lVar17] = psVar11[lVar17];
        lVar17 = lVar17 + 1;
      } while ((uVar16 / 9 & 0xffffffffffffffe0) * 9 != lVar17);
    }
    if (uVar18 != 0) {
      psVar11 = source->d_counts;
      uVar16 = 0;
      do {
        psVar15[uVar16] = psVar11[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar18 != uVar16);
    }
    return;
  }
  exit(-1);
}

Assistant:

void ZopfliCopyLZ77Store(
    const ZopfliLZ77Store* source, ZopfliLZ77Store* dest) {
  size_t i;
  size_t llsize = ZOPFLI_NUM_LL * CeilDiv(source->size, ZOPFLI_NUM_LL);
  size_t dsize = ZOPFLI_NUM_D * CeilDiv(source->size, ZOPFLI_NUM_D);
  ZopfliCleanLZ77Store(dest);
  ZopfliInitLZ77Store(source->data, dest);
  dest->litlens =
      (unsigned short*)malloc(sizeof(*dest->litlens) * source->size);
  dest->dists = (unsigned short*)malloc(sizeof(*dest->dists) * source->size);
  dest->pos = (size_t*)malloc(sizeof(*dest->pos) * source->size);
  dest->ll_symbol =
      (unsigned short*)malloc(sizeof(*dest->ll_symbol) * source->size);
  dest->d_symbol =
      (unsigned short*)malloc(sizeof(*dest->d_symbol) * source->size);
  dest->ll_counts = (size_t*)malloc(sizeof(*dest->ll_counts) * llsize);
  dest->d_counts = (size_t*)malloc(sizeof(*dest->d_counts) * dsize);

  /* Allocation failed. */
  if (!dest->litlens || !dest->dists) exit(-1);
  if (!dest->pos) exit(-1);
  if (!dest->ll_symbol || !dest->d_symbol) exit(-1);
  if (!dest->ll_counts || !dest->d_counts) exit(-1);

  dest->size = source->size;
  for (i = 0; i < source->size; i++) {
    dest->litlens[i] = source->litlens[i];
    dest->dists[i] = source->dists[i];
    dest->pos[i] = source->pos[i];
    dest->ll_symbol[i] = source->ll_symbol[i];
    dest->d_symbol[i] = source->d_symbol[i];
  }
  for (i = 0; i < llsize; i++) {
    dest->ll_counts[i] = source->ll_counts[i];
  }
  for (i = 0; i < dsize; i++) {
    dest->d_counts[i] = source->d_counts[i];
  }
}